

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::subSaturateUI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Literal *other_local;
  Literal *this_local;
  
  binary<8,_&wasm::Literal::getLanesSI16x8,_&wasm::Literal::subSatUI16,_&wasm::passThrough>
            (__return_storage_ptr__,this,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::subSaturateUI16x8(const Literal& other) const {
  return binary<8, &Literal::getLanesSI16x8, &Literal::subSatUI16>(*this,
                                                                   other);
}